

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter-array.cpp
# Opt level: O0

size_t __thiscall
traverse_impl::anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this,int from,int to)

{
  int to_local;
  int from_local;
  anon_class_1_0_00000001 *this_local;
  
  return (long)from << 0x20 | (long)to;
}

Assistant:

auto traverse_impl(const tree_t& tree, int from, int to, cache_t& cache) -> long long {
  auto cache_key = [](int from, int to) {
    return static_cast<size_t>(from) << 32u | static_cast<size_t>(to);
  };

  if (cache.contains(cache_key(from, to))) // if we've seen path (from, to), use the cached value
    return cache.at(cache_key(from, to));

  // check if the tree contains adapters that will lead to `to`
  if (!tree.contains(to))
    return 0;
  const auto& down = tree.at(to);
  // for each adapter that leads to `to`, traverse again. If this is the start, count the path `+1`.
  auto ways = std::accumulate(down.cbegin(), down.cend(), 0ll, [&](auto a, auto i) {
    if (i == from) // if at the end, count this is a possible path
      return a + 1;
    return a + traverse_impl(tree, from, i, cache);
  });

  cache[cache_key(from, to)] = ways;
  return ways;
}